

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O3

void SVRG::learn(svrg *s,single_learner *base,example *ec)

{
  sparse_parameters *psVar1;
  bool bVar2;
  int iVar3;
  _func_void_weight_ptr_void_ptr *p_Var4;
  byte bVar5;
  byte bVar6;
  ostream *poVar7;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var8;
  weight *pwVar9;
  uint32_t *puVar10;
  byte bVar11;
  ulong uVar12;
  byte bVar13;
  vw *pvVar14;
  ulong uVar15;
  weight wVar16;
  uint64_t index;
  ulong local_58;
  ulong local_50;
  float *local_48;
  weight local_3c;
  example *local_38;
  
  predict(s,base,ec);
  pvVar14 = s->all;
  iVar3 = (int)pvVar14->passes_complete;
  if (iVar3 % (s->stage_size + 1) == 0) {
    if ((s->prev_pass != iVar3) && (pvVar14->quiet == false)) {
      local_38 = ec;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"svrg pass ",10);
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": committing stable point",0x19);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pvVar14 = s->all;
      if (pvVar14->num_bits < 0x20) {
        uVar15 = 0;
        do {
          bVar11 = (pvVar14->weights).sparse;
          bVar13 = (byte)(pvVar14->weights).sparse_weights._stride_shift;
          bVar6 = (byte)(pvVar14->weights).dense_weights._stride_shift;
          bVar5 = bVar6;
          if ((bool)bVar11 != false) {
            bVar5 = bVar13;
          }
          uVar12 = uVar15 << (bVar5 & 0x3f);
          if ((bool)bVar11 == true) {
            psVar1 = &(pvVar14->weights).sparse_weights;
            local_58 = uVar12 & (pvVar14->weights).sparse_weights._weight_mask;
            _Var8._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_58);
            if (_Var8._M_cur == (__node_type *)0x0) {
              local_48 = calloc_or_throw<float>
                                   (1L << ((byte)(pvVar14->weights).sparse_weights._stride_shift &
                                          0x3f));
              local_50 = local_58;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,float*>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)psVar1,&local_50);
              _Var8._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_58);
              p_Var4 = (pvVar14->weights).sparse_weights.fun;
              if (p_Var4 != (_func_void_weight_ptr_void_ptr *)0x0) {
                (*p_Var4)(*(weight **)((long)_Var8._M_cur + 0x10),
                          (pvVar14->weights).sparse_weights.default_data);
              }
            }
            pwVar9 = *(weight **)
                      ((long)&((_Var8._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                              _M_storage._M_storage + 8);
            pvVar14 = s->all;
            bVar11 = (pvVar14->weights).sparse;
            bVar13 = (byte)(pvVar14->weights).sparse_weights._stride_shift;
            bVar6 = (byte)(pvVar14->weights).dense_weights._stride_shift;
          }
          else {
            pwVar9 = (pvVar14->weights).dense_weights._begin +
                     (uVar12 & (pvVar14->weights).dense_weights._weight_mask);
          }
          if ((bVar11 & 1) != 0) {
            bVar6 = bVar13;
          }
          uVar12 = uVar15 << (bVar6 & 0x3f);
          wVar16 = *pwVar9;
          if ((bVar11 & 1) == 0) {
            pwVar9 = (pvVar14->weights).dense_weights._begin +
                     (uVar12 & (pvVar14->weights).dense_weights._weight_mask);
          }
          else {
            psVar1 = &(pvVar14->weights).sparse_weights;
            local_58 = uVar12 & (pvVar14->weights).sparse_weights._weight_mask;
            local_3c = wVar16;
            _Var8._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_58);
            if (_Var8._M_cur == (__node_type *)0x0) {
              local_48 = calloc_or_throw<float>
                                   (1L << ((byte)(pvVar14->weights).sparse_weights._stride_shift &
                                          0x3f));
              local_50 = local_58;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,float*>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)psVar1,&local_50);
              _Var8._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_58);
              p_Var4 = (pvVar14->weights).sparse_weights.fun;
              if (p_Var4 != (_func_void_weight_ptr_void_ptr *)0x0) {
                (*p_Var4)(*(weight **)((long)_Var8._M_cur + 0x10),
                          (pvVar14->weights).sparse_weights.default_data);
              }
            }
            pwVar9 = *(weight **)
                      ((long)&((_Var8._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                              _M_storage._M_storage + 8);
            wVar16 = local_3c;
          }
          pwVar9[1] = wVar16;
          pvVar14 = s->all;
          bVar2 = (pvVar14->weights).sparse;
          puVar10 = &(pvVar14->weights).dense_weights._stride_shift;
          if (bVar2 != false) {
            puVar10 = &(pvVar14->weights).sparse_weights._stride_shift;
          }
          uVar12 = uVar15 << ((byte)*puVar10 & 0x3f);
          if (bVar2 == true) {
            psVar1 = &(pvVar14->weights).sparse_weights;
            local_58 = uVar12 & (pvVar14->weights).sparse_weights._weight_mask;
            _Var8._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)psVar1,&local_58);
            if (_Var8._M_cur == (__node_type *)0x0) {
              local_48 = calloc_or_throw<float>
                                   (1L << ((byte)(pvVar14->weights).sparse_weights._stride_shift &
                                          0x3f));
              local_50 = local_58;
              std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_long,float*>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)psVar1,&local_50);
              _Var8._M_cur = (__node_type *)
                             std::
                             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                     *)psVar1,&local_58);
              p_Var4 = (pvVar14->weights).sparse_weights.fun;
              if (p_Var4 != (_func_void_weight_ptr_void_ptr *)0x0) {
                (*p_Var4)(*(weight **)((long)_Var8._M_cur + 0x10),
                          (pvVar14->weights).sparse_weights.default_data);
              }
            }
            pwVar9 = *(weight **)
                      ((long)&((_Var8._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>.
                              _M_storage._M_storage + 8);
          }
          else {
            pwVar9 = (pvVar14->weights).dense_weights._begin +
                     (uVar12 & (pvVar14->weights).dense_weights._weight_mask);
          }
          pwVar9[2] = 0.0;
          pvVar14 = s->all;
          uVar15 = uVar15 + 1;
        } while (uVar15 < (1L << ((byte)pvVar14->num_bits & 0x3f) & 0xffffffffU));
      }
      s->stable_grad_count = 0;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"svrg pass ",10);
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": computing exact gradient",0x1a);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      ec = local_38;
    }
    update_stable(s,ec);
    s->stable_grad_count = s->stable_grad_count + 1;
  }
  else {
    if ((s->prev_pass != iVar3) && (pvVar14->quiet == false)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"svrg pass ",10);
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": taking steps",0xe);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    update_inner(s,ec);
  }
  s->prev_pass = iVar3;
  return;
}

Assistant:

void learn(svrg& s, single_learner& base, example& ec)
{
  assert(ec.in_use);

  predict(s, base, ec);

  const int pass = (int)s.all->passes_complete;

  if (pass % (s.stage_size + 1) == 0)  // Compute exact gradient
  {
    if (s.prev_pass != pass && !s.all->quiet)
    {
      cout << "svrg pass " << pass << ": committing stable point" << endl;
      for (uint32_t j = 0; j < VW::num_weights(*s.all); j++)
      {
        float w = VW::get_weight(*s.all, j, W_INNER);
        VW::set_weight(*s.all, j, W_STABLE, w);
        VW::set_weight(*s.all, j, W_STABLEGRAD, 0.f);
      }
      s.stable_grad_count = 0;
      cout << "svrg pass " << pass << ": computing exact gradient" << endl;
    }
    update_stable(s, ec);
    s.stable_grad_count++;
  }
  else  // Perform updates
  {
    if (s.prev_pass != pass && !s.all->quiet)
    {
      cout << "svrg pass " << pass << ": taking steps" << endl;
    }
    update_inner(s, ec);
  }

  s.prev_pass = pass;
}